

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O0

void __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
::clear(flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
        *this)

{
  char *buffer;
  buffer_type *pbVar1;
  size_type buffer_size;
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  *this_local;
  
  validate_pointer_invariants(this);
  pbVar1 = buff(this);
  if (pbVar1->begin != (pointer_type)0x0) {
    pbVar1 = buff(this);
    buffer = pbVar1->begin;
    buffer_size = total_capacity(this);
    deallocate_buffer(this,buffer,buffer_size);
    pbVar1 = buff(this);
    buffer_t<char>::clear(pbVar1);
  }
  validate_pointer_invariants(this);
  return;
}

Assistant:

void clear() noexcept {
        validate_pointer_invariants();
        if (buff().begin) {
            deallocate_buffer(buff().begin, total_capacity());
            buff().clear();
        }
        validate_pointer_invariants();
    }